

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry.h
# Opt level: O0

void google::protobuf::internal::
     MapEntry<long,_google::protobuf::Message,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)11>
     ::SharedDtor(MessageLite *msg)

{
  MapEntry<long,_google::protobuf::Message,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_;
  MessageLite *msg_local;
  
  InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&msg->_internal_metadata_);
  MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)3,_long>::DeleteNoArena
            (&msg[1]._internal_metadata_.ptr_);
  MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_google::protobuf::Message>
  ::DeleteNoArena((Message *)msg[2]._vptr_MessageLite);
  return;
}

Assistant:

static void SharedDtor(MessageLite& msg) {
    auto& this_ = static_cast<MapEntry&>(msg);
    this_._internal_metadata_.template Delete<UnknownFieldSet>();
    KeyTypeHandler::DeleteNoArena(this_._impl_.key_);
    ValueTypeHandler::DeleteNoArena(this_._impl_.value_);
  }